

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfStatement.cpp
# Opt level: O0

void __thiscall
hdc::IfStatement::IfStatement
          (IfStatement *this,Expression *expression,CompoundStatement *statements,
          ElifStatement *elifStatement)

{
  ElifStatement *elifStatement_local;
  CompoundStatement *statements_local;
  Expression *expression_local;
  IfStatement *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00221c78;
  this->expression = expression;
  this->statements = statements;
  this->elifStatement = elifStatement;
  this->elseStatement = (ElseStatement *)0x0;
  this->symbolTable = (SymbolTable *)0x0;
  ASTNode::setKind((ASTNode *)this,AST_IF);
  return;
}

Assistant:

IfStatement::IfStatement(Expression* expression, CompoundStatement* statements, ElifStatement* elifStatement) {
    this->expression = expression;
    this->statements = statements;
    this->elifStatement = elifStatement;
    this->elseStatement = nullptr;
    this->symbolTable = nullptr;
    setKind(AST_IF);
}